

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O2

void __thiscall Channel::~Channel(Channel *this)

{
  std::_Function_base::~_Function_base(&(this->connHandler_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->errorHandler_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->writeHandler_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->readHandler_).super__Function_base);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->holder_).super___weak_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Channel::~Channel(){
    // close(fd_);
}